

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

bool __thiscall
sentencepiece::unigram::Model::VerifyOutputsEquivalent
          (Model *this,string_view expected,string_view actual)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string_view str;
  string_view str_00;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  float fVar5;
  float extraout_XMM0_Da;
  float actual_score;
  float expected_score;
  anon_class_8_1_8991fb9c compute_unigram_model_score;
  Splitter *in_stack_fffffffffffffe48;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe78;
  undefined2 uVar6;
  size_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffea8;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffeb0;
  Die local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [48];
  float local_98;
  float local_3c;
  undefined8 local_28;
  undefined8 uStack_20;
  bool local_1;
  
  uVar6 = (undefined2)((ulong)in_stack_fffffffffffffe78 >> 0x30);
  str._M_str = in_stack_fffffffffffffe88;
  str._M_len = in_stack_fffffffffffffe80;
  local_28 = in_RCX;
  uStack_20 = in_R8;
  absl::StrSplit(str,(char)((ulong)in_stack_fffffffffffffe78 >> 0x38),
                 SUB81((ulong)in_stack_fffffffffffffe78 >> 0x30,0));
  absl::internal::Splitter::operator_cast_to_vector(in_stack_fffffffffffffe48);
  fVar5 = VerifyOutputsEquivalent::anon_class_8_1_8991fb9c::operator()
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe60);
  absl::internal::Splitter::~Splitter((Splitter *)0x48524d);
  local_d8 = local_28;
  uStack_d0 = uStack_20;
  str_00._M_str = in_stack_fffffffffffffe88;
  str_00._M_len = in_stack_fffffffffffffe80;
  local_3c = fVar5;
  absl::StrSplit(str_00,(char)((ushort)uVar6 >> 8),SUB21(uVar6,0));
  absl::internal::Splitter::operator_cast_to_vector(in_stack_fffffffffffffe48);
  fVar5 = VerifyOutputsEquivalent::anon_class_8_1_8991fb9c::operator()
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe60);
  iVar1 = (int)local_c8;
  absl::internal::Splitter::~Splitter((Splitter *)0x4852ed);
  local_98 = fVar5;
  std::abs(iVar1);
  if (extraout_XMM0_Da <= 1e-07) {
    local_1 = true;
  }
  else {
    iVar1 = logging::GetMinLogLevel();
    if (iVar1 < 2) {
      error::Die::Die(&local_d9,false);
      pcVar2 = logging::BaseName((char *)in_stack_fffffffffffffe48);
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x371);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"LOG(");
      poVar3 = std::operator<<(poVar3,"WARNING");
      poVar3 = std::operator<<(poVar3,") ");
      std::operator<<(poVar3,"Two sentence piece sequences are not equivalent! Left: ");
      __str._M_str = (char *)in_stack_fffffffffffffe60;
      __str._M_len = in_stack_fffffffffffffe58;
      pbVar4 = std::operator<<(in_stack_fffffffffffffe50,__str);
      poVar3 = std::operator<<(pbVar4,", Score: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3c);
      std::operator<<(poVar3,". Right: ");
      __str_00._M_str = (char *)in_stack_fffffffffffffe60;
      __str_00._M_len = in_stack_fffffffffffffe58;
      pbVar4 = std::operator<<(in_stack_fffffffffffffe50,__str_00);
      poVar3 = std::operator<<(pbVar4,", Score: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_98);
      poVar3 = std::operator<<(poVar3,".");
      error::Die::operator&(&local_d9,poVar3);
      error::Die::~Die((Die *)poVar3);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Model::VerifyOutputsEquivalent(absl::string_view expected,
                                    absl::string_view actual) const {
  auto compute_unigram_model_score =
      [this](std::vector<absl::string_view> output_pieces) {
        float total_score = 0;
        const float unk_score = min_score() - kUnkPenalty;
        for (const auto p : output_pieces) {
          const auto id = PieceToId(p);
          if (id == unk_id_) {
            total_score += unk_score;
          } else {
            const int length = p.size();
            total_score += IsUserDefinedInlined(id)
                               ? (length * max_score_ - 0.1)
                               : GetScoreInlined(id);
          }
        }
        return total_score;
      };
  const auto expected_score =
      compute_unigram_model_score(absl::StrSplit(expected, ' '));
  const auto actual_score =
      compute_unigram_model_score(absl::StrSplit(actual, ' '));
  if (std::abs(expected_score - actual_score) > kEpsilon) {
    LOG(WARNING) << "Two sentence piece sequences are not equivalent! Left: "
                 << expected << ", Score: " << expected_score
                 << ". Right: " << actual << ", Score: " << actual_score << ".";
    return false;
  }
  return true;
}